

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O3

bool __thiscall spirv_cross::Compiler::is_vertex_like_shader(Compiler *this)

{
  __node_base_ptr p_Var1;
  ulong __code;
  
  __code = (ulong)(this->ir).default_entry_point.id;
  p_Var1 = ::std::
           _Hashtable<spirv_cross::TypedID<(spirv_cross::Types)4>,_std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>_>,_std::__detail::_Select1st,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::_M_find_before_node
                     (&(this->ir).entry_points._M_h,
                      __code % (this->ir).entry_points._M_h._M_bucket_count,
                      &(this->ir).default_entry_point,__code);
  return *(uint *)&p_Var1->_M_nxt[0x1f]._M_nxt < 4;
}

Assistant:

bool Compiler::is_vertex_like_shader() const
{
	auto model = get_execution_model();
	return model == ExecutionModelVertex || model == ExecutionModelGeometry ||
	       model == ExecutionModelTessellationControl || model == ExecutionModelTessellationEvaluation;
}